

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dir.c
# Opt level: O0

int TIFFVSetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  int iVar1;
  int local_24;
  __va_list_tag *ap_local;
  uint32_t tag_local;
  TIFF *tif_local;
  
  iVar1 = OkToChangeTag(tif,tag);
  if (iVar1 == 0) {
    local_24 = 0;
  }
  else {
    local_24 = (*(tif->tif_tagmethods).vsetfield)(tif,tag,ap);
  }
  return local_24;
}

Assistant:

int TIFFVSetField(TIFF *tif, uint32_t tag, va_list ap)
{
    return OkToChangeTag(tif, tag)
               ? (*tif->tif_tagmethods.vsetfield)(tif, tag, ap)
               : 0;
}